

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mode.h
# Opt level: O0

rgba_t sfc::normalize_color(rgba_t color,Mode from_mode)

{
  code *pcVar1;
  rgba_color local_18;
  Mode local_14;
  rgba_color c;
  Mode from_mode_local;
  rgba_t color_local;
  
  local_14 = from_mode;
  c = (rgba_color)color;
  rgba_color::rgba_color(&local_18,color);
  switch(local_14) {
  case none:
    from_mode_local = none;
    break;
  case snes:
  case snes_mode7:
  case gbc:
  case gba:
  case gba_affine:
    local_18.r = scale_up(local_18.r,3);
    local_18.g = scale_up(local_18.g,3);
    local_18.b = scale_up(local_18.b,3);
    local_18.a = scale_up(local_18.a,3);
    from_mode_local = rgba_color::operator_cast_to_unsigned_int(&local_18);
    break;
  case gb:
  case sms:
    local_18.r = scale_up(local_18.r,6);
    local_18.g = scale_up(local_18.g,6);
    local_18.b = scale_up(local_18.b,6);
    local_18.a = scale_up(local_18.a,6);
    from_mode_local = rgba_color::operator_cast_to_unsigned_int(&local_18);
    break;
  case md:
  case pce:
  case pce_sprite:
  case ws:
  case ngp:
    local_18.r = scale_up(local_18.r,5);
    local_18.g = scale_up(local_18.g,5);
    local_18.b = scale_up(local_18.b,5);
    local_18.a = scale_up(local_18.a,5);
    from_mode_local = rgba_color::operator_cast_to_unsigned_int(&local_18);
    break;
  case wsc:
  case wsc_packed:
  case ngpc:
  case gg:
    local_18.r = scale_up(local_18.r,4);
    local_18.g = scale_up(local_18.g,4);
    local_18.b = scale_up(local_18.b,4);
    local_18.a = scale_up(local_18.a,4);
    from_mode_local = rgba_color::operator_cast_to_unsigned_int(&local_18);
    break;
  default:
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  return from_mode_local;
}

Assistant:

inline rgba_t normalize_color(const rgba_t color, Mode from_mode) {
  rgba_color c(color);
  switch (from_mode) {
  case Mode::snes:
  case Mode::snes_mode7:
  case Mode::gbc:
  case Mode::gba:
  case Mode::gba_affine:
    c.r = scale_up(c.r, 3);
    c.g = scale_up(c.g, 3);
    c.b = scale_up(c.b, 3);
    c.a = scale_up(c.a, 3);
    return c;
  case Mode::gb:
  case Mode::sms:
    c.r = scale_up(c.r, 6);
    c.g = scale_up(c.g, 6);
    c.b = scale_up(c.b, 6);
    c.a = scale_up(c.a, 6);
    return c;
  case Mode::wsc:
  case Mode::wsc_packed:
  case Mode::ngpc:
  case Mode::gg:
    c.r = scale_up(c.r, 4);
    c.g = scale_up(c.g, 4);
    c.b = scale_up(c.b, 4);
    c.a = scale_up(c.a, 4);
    return c;
  case Mode::md:
  case Mode::pce:
  case Mode::pce_sprite:
  case Mode::ws:
  case Mode::ngp:
    c.r = scale_up(c.r, 5);
    c.g = scale_up(c.g, 5);
    c.b = scale_up(c.b, 5);
    c.a = scale_up(c.a, 5);
    return c;
  case Mode::none:
    return 0;
  }
}